

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[35],std::__cxx11::string,char[70],std::__cxx11::string,char[73]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [35],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs,
               char (*RestArgs_1) [70],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_2,
               char (*RestArgs_3) [73])

{
  char (*RestArgs_local_3) [73];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_local_2;
  char (*RestArgs_local_1) [70];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_local;
  char (*FirstArg_local) [35];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[35]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string,char[70],std::__cxx11::string,char[73]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}